

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::back(span<int,_18446744073709551615UL> *this)

{
  logic_error *this_00;
  undefined **local_20 [2];
  
  if (this->size_ != 0) {
    return this->data_ + (this->size_ - 1);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1288: Precondition violation."
            );
  local_20[0] = &PTR__logic_error_001e9b38;
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001e9b38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr size_type size() const span_noexcept
    {
        return size_;
    }